

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

bool __thiscall
pbrt::Curve::IntersectRay(Curve *this,Ray *r,Float tMax,optional<pbrt::ShapeIntersection> *si)

{
  undefined1 auVar1 [16];
  initializer_list<pbrt::Point3<float>_> v;
  bool bVar2;
  int iVar3;
  float *pfVar4;
  Bounds3<float> *b2;
  Bounds3<float> *b1;
  Point3<float> *pPVar5;
  long *in_RDI;
  array<pbrt::Point3<float>,_4> *paVar6;
  long in_FS_OFFSET;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 extraout_var [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  float fVar17;
  Vector3<float> VVar18;
  Point3<float> PVar19;
  span<const_pbrt::Point3<float>_> cpSpan;
  int maxDepth;
  int r0;
  Float eps;
  int i;
  Float L0;
  Bounds3f rayBounds;
  Bounds3f curveBounds;
  Float maxWidth;
  array<pbrt::Point3<float>,_4> cp;
  Transform rayFromObject;
  Vector3f dy;
  Vector3f dx;
  array<pbrt::Point3<float>,_4> cpObj;
  Ray ray;
  int in_stack_0000047c;
  Float in_stack_00000480;
  Float in_stack_00000484;
  Transform *in_stack_00000488;
  Float in_stack_00000494;
  Ray *in_stack_00000498;
  Curve *in_stack_000004a0;
  span<const_pbrt::Point3<float>_> in_stack_000004a8;
  optional<pbrt::ShapeIntersection> *in_stack_000004d0;
  Point3<float> (*in_stack_fffffffffffffbf8) [4];
  float in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc04;
  undefined4 in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc0c;
  float in_stack_fffffffffffffc10;
  float in_stack_fffffffffffffc14;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  Point3<float> *in_stack_fffffffffffffc28;
  Vector3<float> *in_stack_fffffffffffffc30;
  Bounds3<float> *this_00;
  iterator in_stack_fffffffffffffc48;
  size_type in_stack_fffffffffffffc50;
  Bounds3<float> *in_stack_fffffffffffffc80;
  Float in_stack_fffffffffffffcc0;
  Float in_stack_fffffffffffffcc4;
  span<const_pbrt::Point3<float>_> in_stack_fffffffffffffcc8;
  Float *in_stack_fffffffffffffcd8;
  Ray *in_stack_fffffffffffffce0;
  Transform *in_stack_fffffffffffffce8;
  float local_2d0;
  float local_2cc;
  float local_2c8;
  int local_2c4;
  float local_2c0 [7];
  Bounds3<float> local_2a4;
  Tuple3<pbrt::Point3,_float> local_28c [4];
  Point3<float> *in_stack_fffffffffffffda8;
  Transform *in_stack_fffffffffffffdb0;
  Bounds3<float> local_244;
  Float local_22c;
  Float local_228;
  float local_224;
  undefined8 local_220;
  float local_218;
  undefined8 local_210;
  float local_208;
  undefined8 local_200;
  float local_1f8;
  undefined8 local_1f0;
  float local_1e8;
  undefined8 local_1e0;
  float local_1d8;
  undefined8 local_1d4;
  float local_1cc;
  undefined8 local_1c8;
  float local_1c0;
  undefined8 local_1bc;
  float local_1b4;
  undefined8 *local_1b0;
  undefined8 local_1a8;
  array<pbrt::Point3<float>,_4> local_1a0;
  undefined8 local_170;
  float local_168;
  undefined8 local_160;
  float local_158;
  array<pbrt::Point3<float>,_4> local_154 [2];
  Tuple3<pbrt::Vector3,_float> local_c8;
  Point3f *up;
  undefined4 in_stack_ffffffffffffff54;
  Point3f *pos;
  Tuple3<pbrt::Vector3,_float> local_9c [2];
  array<pbrt::Point3<float>,_4> local_80;
  Bounds3<float> local_50 [3];
  bool local_1;
  undefined1 auVar16 [56];
  
  *(long *)(in_FS_OFFSET + -0x488) = *(long *)(in_FS_OFFSET + -0x488) + 1;
  Transform::operator()
            (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  pstd::span<pbrt::Point3<float>const>::span<4ul>
            ((span<const_pbrt::Point3<float>_> *)
             CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),in_stack_fffffffffffffbf8
            );
  auVar16 = (undefined1  [56])0x0;
  CubicBezierControlPoints<pbrt::Point3<float>>
            (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0);
  fVar8 = (float)((ulong)&local_50[0].pMax >> 0x20);
  pstd::array<pbrt::Point3<float>,_4>::operator[](&local_80,3);
  pstd::array<pbrt::Point3<float>,_4>::operator[](&local_80,0);
  VVar18 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10)
                      ,(Point3<float> *)
                       CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
  fVar17 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar16;
  up = (Point3f *)vmovlpd_avx(auVar9._0_16_);
  pos = up;
  VVar18 = Cross<float>((Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                        (Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
  local_c8.z = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar16;
  local_c8._0_8_ = vmovlpd_avx(auVar10._0_16_);
  local_9c[0]._0_8_ = local_c8._0_8_;
  local_9c[0].z = local_c8.z;
  fVar7 = LengthSquared<float>((Vector3<float> *)local_9c);
  auVar16 = extraout_var;
  if ((fVar7 == 0.0) && (!NAN(fVar7))) {
    Vector3<float>::Vector3((Vector3<float> *)0x790854);
    CoordinateSystem<float>
              (in_stack_fffffffffffffc30,(Vector3<float> *)in_stack_fffffffffffffc28,
               (Vector3<float> *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
  }
  this_00 = local_50;
  PVar19 = Point3<float>::operator+
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10)
                      ,(Vector3<float> *)
                       CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
  local_168 = PVar19.super_Tuple3<pbrt::Point3,_float>.z;
  auVar11._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar11._8_56_ = auVar16;
  local_170 = vmovlpd_avx(auVar11._0_16_);
  paVar6 = local_154;
  local_160 = local_170;
  local_158 = local_168;
  LookAt(pos,(Point3f *)CONCAT44(in_stack_ffffffffffffff54,fVar17),(Vector3f *)up);
  pstd::array<pbrt::Point3<float>,_4>::operator[](&local_80,0);
  PVar19 = Transform::operator()(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  local_1e8 = PVar19.super_Tuple3<pbrt::Point3,_float>.z;
  auVar12._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar12._8_56_ = auVar16;
  local_1f0 = vmovlpd_avx(auVar12._0_16_);
  local_1e0 = local_1f0;
  local_1d8 = local_1e8;
  pstd::array<pbrt::Point3<float>,_4>::operator[](&local_80,1);
  PVar19 = Transform::operator()(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  local_1f8 = PVar19.super_Tuple3<pbrt::Point3,_float>.z;
  auVar13._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar13._8_56_ = auVar16;
  local_200 = vmovlpd_avx(auVar13._0_16_);
  local_1d4 = local_200;
  local_1cc = local_1f8;
  pstd::array<pbrt::Point3<float>,_4>::operator[](&local_80,2);
  PVar19 = Transform::operator()(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  local_208 = PVar19.super_Tuple3<pbrt::Point3,_float>.z;
  auVar14._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar14._8_56_ = auVar16;
  local_210 = vmovlpd_avx(auVar14._0_16_);
  local_1c8 = local_210;
  local_1c0 = local_208;
  pstd::array<pbrt::Point3<float>,_4>::operator[](&local_80,3);
  PVar19 = Transform::operator()(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  local_218 = PVar19.super_Tuple3<pbrt::Point3,_float>.z;
  auVar15._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar15._8_56_ = auVar16;
  local_220 = vmovlpd_avx(auVar15._0_16_);
  local_1b0 = &local_1e0;
  local_1a8 = 4;
  v._M_len = in_stack_fffffffffffffc50;
  v._M_array = in_stack_fffffffffffffc48;
  local_1bc = local_220;
  local_1b4 = local_218;
  pstd::array<pbrt::Point3<float>,_4>::array(paVar6,v);
  local_228 = Lerp(*(Float *)(in_RDI + 1),*(Float *)(*in_RDI + 0x34),*(Float *)(*in_RDI + 0x38));
  local_22c = Lerp(*(Float *)((long)in_RDI + 0xc),*(Float *)(*in_RDI + 0x34),
                   *(Float *)(*in_RDI + 0x38));
  pfVar4 = std::max<float>(&local_228,&local_22c);
  local_224 = *pfVar4;
  b2 = (Bounds3<float> *)pstd::array<pbrt::Point3<float>,_4>::operator[](&local_1a0,0);
  pstd::array<pbrt::Point3<float>,_4>::operator[](&local_1a0,1);
  Bounds3<float>::Bounds3
            (this_00,in_stack_fffffffffffffc28,
             (Point3<float> *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
  b1 = (Bounds3<float> *)pstd::array<pbrt::Point3<float>,_4>::operator[](&local_1a0,2);
  pstd::array<pbrt::Point3<float>,_4>::operator[](&local_1a0,3);
  Bounds3<float>::Bounds3
            (this_00,in_stack_fffffffffffffc28,
             (Point3<float> *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
  Union<float>(b1,b2);
  Expand<float,float>(in_stack_fffffffffffffc80,fVar8);
  local_244.pMin.super_Tuple3<pbrt::Point3,_float>.x = local_28c[0].x;
  local_244.pMin.super_Tuple3<pbrt::Point3,_float>.y = local_28c[0].y;
  local_244.pMin.super_Tuple3<pbrt::Point3,_float>.z = local_28c[0].z;
  local_244.pMax.super_Tuple3<pbrt::Point3,_float>.x = local_28c[1].x;
  local_244.pMax.super_Tuple3<pbrt::Point3,_float>.y = local_28c[1].y;
  local_244.pMax.super_Tuple3<pbrt::Point3,_float>.z = local_28c[1].z;
  Point3<float>::Point3
            ((Point3<float> *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
             (float)((ulong)in_stack_fffffffffffffbf8 >> 0x20),SUB84(in_stack_fffffffffffffbf8,0),
             0.0);
  Length<float>((Vector3<float> *)0x790be0);
  Point3<float>::Point3
            ((Point3<float> *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
             (float)((ulong)in_stack_fffffffffffffbf8 >> 0x20),SUB84(in_stack_fffffffffffffbf8,0),
             0.0);
  Bounds3<float>::Bounds3
            (this_00,in_stack_fffffffffffffc28,
             (Point3<float> *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
  bVar2 = Overlaps<float>(&local_2a4,&local_244);
  if (bVar2) {
    local_2c0[0] = 0.0;
    for (local_2c4 = 0; local_2c4 < 2; local_2c4 = local_2c4 + 1) {
      pPVar5 = pstd::array<pbrt::Point3<float>,_4>::operator[](&local_1a0,(long)local_2c4);
      in_stack_fffffffffffffc10 = (pPVar5->super_Tuple3<pbrt::Point3,_float>).x;
      pPVar5 = pstd::array<pbrt::Point3<float>,_4>::operator[](&local_1a0,(long)(local_2c4 + 1));
      auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),
                               ZEXT416((uint)(pPVar5->super_Tuple3<pbrt::Point3,_float>).x),
                               ZEXT416((uint)in_stack_fffffffffffffc10));
      in_stack_fffffffffffffc14 = auVar1._0_4_;
      paVar6 = &local_1a0;
      pPVar5 = pstd::array<pbrt::Point3<float>,_4>::operator[](paVar6,(long)(local_2c4 + 2));
      fVar8 = in_stack_fffffffffffffc14 + (pPVar5->super_Tuple3<pbrt::Point3,_float>).x;
      std::abs((int)paVar6);
      local_2c8 = fVar8;
      pPVar5 = pstd::array<pbrt::Point3<float>,_4>::operator[](&local_1a0,(long)local_2c4);
      fVar8 = (pPVar5->super_Tuple3<pbrt::Point3,_float>).y;
      pPVar5 = pstd::array<pbrt::Point3<float>,_4>::operator[](&local_1a0,(long)(local_2c4 + 1));
      auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),
                               ZEXT416((uint)(pPVar5->super_Tuple3<pbrt::Point3,_float>).y),
                               ZEXT416((uint)fVar8));
      paVar6 = &local_1a0;
      pPVar5 = pstd::array<pbrt::Point3<float>,_4>::operator[](paVar6,(long)(local_2c4 + 2));
      fVar8 = auVar1._0_4_ + (pPVar5->super_Tuple3<pbrt::Point3,_float>).y;
      std::abs((int)paVar6);
      local_2cc = fVar8;
      pfVar4 = std::max<float>(&local_2c8,&local_2cc);
      pPVar5 = pstd::array<pbrt::Point3<float>,_4>::operator[](&local_1a0,(long)local_2c4);
      fVar8 = (pPVar5->super_Tuple3<pbrt::Point3,_float>).z;
      pPVar5 = pstd::array<pbrt::Point3<float>,_4>::operator[](&local_1a0,(long)(local_2c4 + 1));
      auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),
                               ZEXT416((uint)(pPVar5->super_Tuple3<pbrt::Point3,_float>).z),
                               ZEXT416((uint)fVar8));
      fVar8 = auVar1._0_4_;
      paVar6 = &local_1a0;
      pPVar5 = pstd::array<pbrt::Point3<float>,_4>::operator[](paVar6,(long)(local_2c4 + 2));
      fVar8 = fVar8 + (pPVar5->super_Tuple3<pbrt::Point3,_float>).z;
      std::abs((int)paVar6);
      local_2d0 = fVar8;
      pfVar4 = std::max<float>(pfVar4,&local_2d0);
      pfVar4 = std::max<float>(local_2c0,pfVar4);
      local_2c0[0] = *pfVar4;
    }
    std::max<float>((float *)(*in_RDI + 0x34),(float *)(*in_RDI + 0x38));
    iVar3 = Log2Int(in_stack_fffffffffffffc00);
    Clamp<int,int,int>(iVar3 / 2,0,10);
    pstd::span<pbrt::Point3<float>const>::
    span<pstd::array<pbrt::Point3<float>,4>,void,pstd::array<pbrt::Point3<float>,4>>
              ((span<const_pbrt::Point3<float>_> *)
               CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
               (array<pbrt::Point3<float>,_4> *)
               CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
    Inverse((Transform *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    local_1 = RecursiveIntersect(in_stack_000004a0,in_stack_00000498,in_stack_00000494,
                                 in_stack_000004a8,in_stack_00000488,in_stack_00000484,
                                 in_stack_00000480,in_stack_0000047c,in_stack_000004d0);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Curve::IntersectRay(const Ray &r, Float tMax,
                         pstd::optional<ShapeIntersection> *si) const {
#ifndef PBRT_IS_GPU_CODE
    ++nCurveTests;
#endif
    // Transform _Ray_ to curve's object space
    Ray ray = (*common->objectFromRender)(r);

    // Get object-space control points for curve segment, _cpObj_
    pstd::array<Point3f, 4> cpObj =
        CubicBezierControlPoints(pstd::span<const Point3f>(common->cpObj), uMin, uMax);

    // Project curve control points to plane perpendicular to ray
    Vector3f dx = Cross(ray.d, cpObj[3] - cpObj[0]);
    if (LengthSquared(dx) == 0) {
        Vector3f dy;
        CoordinateSystem(ray.d, &dx, &dy);
    }
    Transform rayFromObject = LookAt(ray.o, ray.o + ray.d, dx);
    pstd::array<Point3f, 4> cp = {rayFromObject(cpObj[0]), rayFromObject(cpObj[1]),
                                  rayFromObject(cpObj[2]), rayFromObject(cpObj[3])};

    // Test ray against bound of projected control points
    Float maxWidth = std::max(Lerp(uMin, common->width[0], common->width[1]),
                              Lerp(uMax, common->width[0], common->width[1]));
    Bounds3f curveBounds = Union(Bounds3f(cp[0], cp[1]), Bounds3f(cp[2], cp[3]));
    curveBounds = Expand(curveBounds, 0.5f * maxWidth);
    Bounds3f rayBounds(Point3f(0, 0, 0), Point3f(0, 0, Length(ray.d) * tMax));
    if (!Overlaps(rayBounds, curveBounds))
        return false;

    // Compute refinement depth for curve, _maxDepth_
    Float L0 = 0;
    for (int i = 0; i < 2; ++i)
        L0 = std::max(
            L0, std::max(std::max(std::abs(cp[i].x - 2 * cp[i + 1].x + cp[i + 2].x),
                                  std::abs(cp[i].y - 2 * cp[i + 1].y + cp[i + 2].y)),
                         std::abs(cp[i].z - 2 * cp[i + 1].z + cp[i + 2].z)));

    Float eps = std::max(common->width[0], common->width[1]) * .05f;  // width / 20
    // Compute log base 4 by dividing log2 in half.
    int r0 = Log2Int(1.41421356237f * 6.f * L0 / (8.f * eps)) / 2;
    int maxDepth = Clamp(r0, 0, 10);

    // Recursively test for ray--curve intersection
    pstd::span<const Point3f> cpSpan(cp);
    return RecursiveIntersect(ray, tMax, cpSpan, Inverse(rayFromObject), uMin, uMax,
                              maxDepth, si);
}